

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization_backend.cpp
# Opt level: O1

unique_ptr<booster::locale::localization_backend,_std::default_delete<booster::locale::localization_backend>_>
 __thiscall booster::locale::localization_backend_manager::impl::get(impl *this)

{
  long lVar1;
  long lVar2;
  actual_backend *this_00;
  ulong uVar3;
  ulong uVar4;
  long *in_RSI;
  bool bVar5;
  vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  backends;
  vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = *in_RSI;
  if (in_RSI[1] != lVar2) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      std::
      vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
      ::push_back(&local_48,(value_type *)(lVar2 + uVar3 * 0x30 + 0x20));
      lVar2 = *in_RSI;
      uVar3 = (in_RSI[1] - lVar2 >> 4) * -0x5555555555555555;
      bVar5 = uVar4 <= uVar3;
      lVar1 = uVar3 - uVar4;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar5 && lVar1 != 0);
  }
  this_00 = (actual_backend *)operator_new(0x38);
  actual_backend::actual_backend
            (this_00,&local_48,(vector<int,_std::allocator<int>_> *)(in_RSI + 3));
  (this->all_backends_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  std::
  vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  ::~vector(&local_48);
  return (__uniq_ptr_data<booster::locale::localization_backend,_std::default_delete<booster::locale::localization_backend>,_true,_true>
          )(__uniq_ptr_data<booster::locale::localization_backend,_std::default_delete<booster::locale::localization_backend>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<localization_backend> get() const
            {
                std::vector<booster::shared_ptr<localization_backend> > backends;
                for(unsigned i=0;i<all_backends_.size();i++)
                    backends.push_back(all_backends_[i].second);
                std::unique_ptr<localization_backend> res(new actual_backend(backends,default_backends_));
                return res;
            }